

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_vprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *zIn;
  int local_6c;
  int n;
  int nLen;
  SySet sArg;
  jx9_hashmap *pMap;
  char *zFormat;
  jx9_int64 nCounter;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zFormat = (char *)0x0;
  nCounter = (jx9_int64)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (((1 < nArg) && (iVar1 = jx9_value_is_string(*apArg), iVar1 != 0)) &&
     (iVar1 = jx9_value_is_json_array(*(jx9_value **)(nCounter + 8)), iVar1 != 0)) {
    zIn = jx9_value_to_string(*(jx9_value **)nCounter,&local_6c);
    if (local_6c < 1) {
      jx9_result_int(pjStack_18,0);
      return 0;
    }
    sArg.pUserData = (void *)**(undefined8 **)(nCounter + 8);
    iVar1 = jx9HashmapValuesToSet((jx9_hashmap *)sArg.pUserData,(SySet *)&n);
    jx9InputFormat(printfConsumer,pjStack_18,zIn,local_6c,iVar1,(jx9_value **)sArg.pAllocator,
                   &zFormat,1);
    jx9_result_int64(pjStack_18,(jx9_int64)zFormat);
    SySetRelease((SySet *)&n);
    return 0;
  }
  jx9_result_int(pjStack_18,0);
  return 0;
}

Assistant:

static int jx9Builtin_vprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_int64 nCounter = 0;
	const char *zFormat;
	jx9_hashmap *pMap;
	SySet sArg;
	int nLen, n;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_json_array(apArg[1]) ){
		/* Missing/Invalid arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the hashmap */
	pMap = (jx9_hashmap *)apArg[1]->x.pOther;
	/* Extract arguments from the hashmap */
	n = jx9HashmapValuesToSet(pMap, &sArg);
	/* Format the string */
	jx9InputFormat(printfConsumer, pCtx, zFormat, nLen, n, (jx9_value **)SySetBasePtr(&sArg), (void *)&nCounter, TRUE);
	/* Return the length of the outputted string */
	jx9_result_int64(pCtx, nCounter);
	/* Release the container */
	SySetRelease(&sArg);
	return JX9_OK;
}